

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O1

CF2_F16Dot16 cf2_stack_popFixed(CF2_Stack stack)

{
  CF2_StackNumber *pCVar1;
  int *piVar2;
  int iVar3;
  
  pCVar1 = stack->top;
  if (pCVar1 == stack->buffer) {
    piVar2 = stack->error;
    iVar3 = 0;
    if ((piVar2 != (int *)0x0) && (*piVar2 == 0)) {
      *piVar2 = 0xa1;
      return 0;
    }
  }
  else {
    stack->top = pCVar1 + -1;
    iVar3 = pCVar1[-1].u.r;
    if (pCVar1[-1].type == CF2_NumberFrac) {
      return iVar3 + (iVar3 >> 0x1f) + 0x2000 >> 0xe;
    }
    if (pCVar1[-1].type == CF2_NumberInt) {
      iVar3 = iVar3 << 0x10;
    }
  }
  return iVar3;
}

Assistant:

FT_LOCAL_DEF( CF2_Fixed )
  cf2_stack_popFixed( CF2_Stack  stack )
  {
    if ( stack->top == stack->buffer )
    {
      CF2_SET_ERROR( stack->error, Stack_Underflow );
      return cf2_intToFixed( 0 );    /* underflow */
    }

    stack->top--;

    switch ( stack->top->type )
    {
    case CF2_NumberInt:
      return cf2_intToFixed( stack->top->u.i );
    case CF2_NumberFrac:
      return cf2_fracToFixed( stack->top->u.f );
    default:
      return stack->top->u.r;
    }
  }